

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::enterInitializingModeIterative(Federate *this)

{
  string_view message;
  Modes MVar1;
  bool bVar2;
  int *piVar3;
  undefined4 *puVar4;
  element_type *peVar5;
  undefined8 uVar6;
  long in_RDI;
  HelicsException *anon_var_0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  cmd;
  Modes cmode;
  memory_order __b;
  memory_order __b_2;
  memory_order __b_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_000002e8;
  PotentialInterfacesManager *in_stack_000002f0;
  type in_stack_fffffffffffffde8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  size_t in_stack_fffffffffffffe08;
  char *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe30;
  int iVar7;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 local_190 [132];
  uint local_10c;
  undefined1 local_108 [68];
  int local_c4;
  duration<long,std::ratio<1l,1000l>> local_c0 [12];
  uint local_b4;
  undefined1 local_b0 [68];
  uint local_6c;
  uint local_68;
  Modes local_51;
  int local_44;
  memory_order local_40;
  int local_3c;
  int *local_38;
  undefined4 local_30;
  memory_order local_2c;
  int local_28;
  undefined4 local_24;
  undefined4 *local_20;
  int local_10;
  undefined4 local_c;
  undefined4 *local_8;
  
  MVar1 = CLI::std::atomic<helics::Federate::Modes>::load
                    ((atomic<helics::Federate::Modes> *)(in_RDI + 8),seq_cst);
  local_51 = MVar1;
  if (MVar1 == STARTUP) {
    if (((*(byte *)(in_RDI + 0xf) & 1) == 0) ||
       (bVar2 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                            *)0x30ea00), !bVar2)) {
      peVar5 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x30ef47);
      (*peVar5->_vptr_Core[0x13])(peVar5,(ulong)*(uint *)(in_RDI + 0x10),1);
    }
    else {
      piVar3 = (int *)(in_RDI + 0x70);
      local_3c = 5;
      local_38 = piVar3;
      local_40 = CLI::std::operator&(seq_cst,__memory_order_mask);
      if (local_3c - 1U < 2) {
        local_44 = *piVar3;
      }
      else if (local_3c == 5) {
        local_44 = *piVar3;
      }
      else {
        local_44 = *piVar3;
      }
      if (local_44 == 0) {
        std::
        unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
        ::operator->((unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                      *)0x30eac8);
        PotentialInterfacesManager::initialize
                  ((PotentialInterfacesManager *)CONCAT17(MVar1,in_stack_fffffffffffffe40));
        peVar5 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x30eae0);
        local_68 = *(uint *)(in_RDI + 0x10);
        (*peVar5->_vptr_Core[0x13])(peVar5,(ulong)local_68,1);
        puVar4 = (undefined4 *)(in_RDI + 0x70);
        local_c = 2;
        local_10 = 5;
        local_8 = puVar4;
        CLI::std::operator&(seq_cst,__memory_order_mask);
        if (local_10 == 3) {
          *puVar4 = local_c;
        }
        else if (local_10 == 5) {
          LOCK();
          *puVar4 = local_c;
          UNLOCK();
        }
        else {
          *puVar4 = local_c;
        }
      }
      else if (local_44 == 2) {
        iVar7 = local_3c;
        peVar5 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x30ebdd);
        local_6c = *(uint *)(in_RDI + 0x10);
        (*peVar5->_vptr_Core[0x13])(peVar5,(ulong)local_6c,1);
        peVar5 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x30ec17);
        local_b4 = *(uint *)(in_RDI + 0x10);
        (*peVar5->_vptr_Core[0x5c])(local_b0,peVar5,(ulong)local_b4);
        bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x30ec53);
        if (bVar2) {
          local_c4 = 200;
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_c0,&local_c4);
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                    ((duration<long,_std::ratio<1L,_1000L>_> *)
                     CONCAT44(iVar7,in_stack_fffffffffffffe30));
          peVar5 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x30ec9b);
          local_10c = *(uint *)(in_RDI + 0x10);
          (*peVar5->_vptr_Core[0x5c])(local_108,peVar5,(ulong)local_10c);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
          CLI::std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(in_stack_fffffffffffffdf0);
        }
        while (bVar2 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x30ed16), ((bVar2 ^ 0xffU) & 1) != 0) {
          std::
          unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
          ::operator->((unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                        *)0x30ed2f);
          CLI::std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair(in_stack_fffffffffffffdf0,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffde8);
          PotentialInterfacesManager::processCommand(in_stack_000002f0,in_stack_000002e8);
          CLI::std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(in_stack_fffffffffffffdf0);
          peVar5 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x30ed7a);
          (*peVar5->_vptr_Core[0x5c])(local_190,peVar5,(ulong)*(uint *)(in_RDI + 0x10));
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
          CLI::std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(in_stack_fffffffffffffdf0);
        }
        puVar4 = (undefined4 *)(in_RDI + 0x70);
        local_24 = 3;
        local_28 = 5;
        local_20 = puVar4;
        local_2c = CLI::std::operator&(seq_cst,__memory_order_mask);
        local_30 = local_24;
        if (local_28 == 3) {
          *puVar4 = local_24;
        }
        else if (local_28 == 5) {
          LOCK();
          *puVar4 = local_24;
          UNLOCK();
        }
        else {
          *puVar4 = local_24;
        }
        CLI::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(in_stack_fffffffffffffdf0);
      }
      else {
        peVar5 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x30ef09);
        (*peVar5->_vptr_Core[0x13])(peVar5,(ulong)*(uint *)(in_RDI + 0x10),1);
      }
    }
  }
  else {
    if (MVar1 != PENDING_ITERATIVE_INIT) {
      uVar6 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 in_stack_fffffffffffffdf8);
      message._M_str = in_stack_fffffffffffffe10;
      message._M_len = in_stack_fffffffffffffe08;
      InvalidFunctionCall::InvalidFunctionCall
                ((InvalidFunctionCall *)
                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),message);
      __cxa_throw(uVar6,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
    }
    enterInitializingModeIterativeComplete((Federate *)CONCAT17(0xc,in_stack_fffffffffffffe40));
  }
  return;
}

Assistant:

void Federate::enterInitializingModeIterative()
{
    auto cmode = currentMode.load();
    switch (cmode) {
        case Modes::STARTUP:
            try {
                if (hasPotentialInterfaces && potManager) {
                    switch (potInterfacesSequence.load()) {
                        case 0:
                            potManager->initialize();
                            coreObject->enterInitializingMode(
                                fedID, helics::IterationRequest::FORCE_ITERATION);
                            potInterfacesSequence.store(2);
                            break;
                        case 2: {
                            // respond to query
                            coreObject->enterInitializingMode(
                                fedID, helics::IterationRequest::FORCE_ITERATION);
                            // now check for commands
                            auto cmd = coreObject->getCommand(fedID);
                            if (cmd.first.empty()) {
                                std::this_thread::sleep_for(std::chrono::milliseconds(200));
                                cmd = coreObject->getCommand(fedID);
                            }
                            while (!cmd.first.empty()) {
                                potManager->processCommand(std::move(cmd));
                                cmd = coreObject->getCommand(fedID);
                            }
                            potInterfacesSequence.store(3);
                        } break;
                        default:
                            coreObject->enterInitializingMode(
                                fedID, helics::IterationRequest::FORCE_ITERATION);
                            break;
                    }
                } else {
                    coreObject->enterInitializingMode(fedID, IterationRequest::FORCE_ITERATION);
                }
            }
            catch (const HelicsException&) {
                updateFederateMode(Modes::ERROR_STATE);
                throw;
            }
            break;
        case Modes::PENDING_ITERATIVE_INIT:
            enterInitializingModeIterativeComplete();
            break;
        default:
            throw(InvalidFunctionCall("cannot call iterative initialization from current state"));
    }
}